

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

int mbedtls_mpi_core_fill_random
              (mbedtls_mpi_uint *X,size_t X_limbs,size_t n_bytes,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  ulong A_limbs;
  size_t __n;
  size_t overhead;
  size_t limbs;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t n_bytes_local;
  size_t X_limbs_local;
  mbedtls_mpi_uint *X_local;
  
  A_limbs = (n_bytes >> 3) + (long)(int)(uint)((n_bytes & 7) != 0);
  __n = A_limbs * 8 - n_bytes;
  if (X_limbs < A_limbs) {
    X_local._4_4_ = -4;
  }
  else {
    memset(X,0,__n);
    memset(X + A_limbs,0,(X_limbs - A_limbs) * 8);
    X_local._4_4_ = (*f_rng)(p_rng,(uchar *)((long)X + __n),n_bytes);
    if (X_local._4_4_ == 0) {
      mbedtls_mpi_core_bigendian_to_host(X,A_limbs);
    }
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_core_fill_random(
    mbedtls_mpi_uint *X, size_t X_limbs,
    size_t n_bytes,
    int (*f_rng)(void *, unsigned char *, size_t), void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const size_t limbs = CHARS_TO_LIMBS(n_bytes);
    const size_t overhead = (limbs * ciL) - n_bytes;

    if (X_limbs < limbs) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    memset(X, 0, overhead);
    memset((unsigned char *) X + limbs * ciL, 0, (X_limbs - limbs) * ciL);
    MBEDTLS_MPI_CHK(f_rng(p_rng, (unsigned char *) X + overhead, n_bytes));
    mbedtls_mpi_core_bigendian_to_host(X, limbs);

cleanup:
    return ret;
}